

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int _h;
  void *pvVar1;
  uint _w;
  ulong uVar2;
  int _w_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  if (inch < 4) {
    _w_00 = _w * 4;
    _h = inch;
  }
  else {
    _w_00 = _w * 0x10;
    _h = ((uint)inch >> 2) * -3 + inch;
  }
  uVar7 = 0;
  Mat::create(kernel_tm,_w_00,_h,outch / 4,1,(Allocator *)0x0);
  uVar2 = (ulong)_w;
  if ((int)_w < 1) {
    uVar2 = uVar7;
  }
  for (; (long)(uVar7 | 3) < (long)outch; uVar7 = uVar7 + 4) {
    pvVar1 = (void *)((uVar7 >> 2) * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data)
    ;
    for (uVar3 = 0; (long)(uVar3 | 3) < (long)inch; uVar3 = uVar3 + 4) {
      for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
        for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            *(undefined1 *)((long)pvVar1 + lVar6) =
                 *(undefined1 *)
                  ((long)local_78.data +
                  uVar4 + (uVar3 + lVar6) * (long)local_78.w * local_78.elemsize +
                          local_78.cstep * (uVar5 | uVar7) * local_78.elemsize);
          }
          pvVar1 = (void *)((long)pvVar1 + 4);
        }
      }
    }
    for (; (long)uVar3 < (long)inch; uVar3 = uVar3 + 1) {
      for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          *(undefined1 *)((long)pvVar1 + lVar6) =
               *(undefined1 *)
                ((long)local_78.data +
                uVar4 + (long)local_78.w * uVar3 * local_78.elemsize +
                        (uVar7 + lVar6) * local_78.cstep * local_78.elemsize);
        }
        pvVar1 = (void *)((long)pvVar1 + 4);
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4a-4b-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (inch >= 4)
        kernel_tm.create(16 * maxk, inch / 4 + inch % 4, outch / 4, (size_t)1u);
    else
        kernel_tm.create(4 * maxk, inch, outch / 4, (size_t)1u);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const signed char* k00 = kernel.channel(q + i).row<const signed char>(p);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}